

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::log<char_const(&)[45],int&,int&,unsigned_long_const&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [45],
               int *params_1,int *params_2,unsigned_long *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues;
  undefined4 in_register_00000014;
  int *params_00;
  int *params_01;
  unsigned_long *params_02;
  long lVar4;
  String *in_stack_ffffffffffffff58;
  String local_98;
  String local_80;
  String local_68;
  String local_50;
  
  str<char_const(&)[45]>
            (&local_98,(kj *)params,(char (*) [45])CONCAT44(in_register_00000014,severity));
  str<int&>(&local_80,(kj *)params_1,params_00);
  str<int&>(&local_68,(kj *)params_2,params_01);
  str<unsigned_long_const&>(&local_50,(kj *)params_3,params_02);
  argValues.size_ = (size_t)macroArgs;
  argValues.ptr = in_stack_ffffffffffffff58;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_98,argValues);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_98.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_98.content.size_ + lVar4);
      *(undefined8 *)((long)&local_98.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_98.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_98.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}